

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::ModelDescription::ByteSizeLong(ModelDescription *this)

{
  Rep *pRVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  string *psVar5;
  void **ppvVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  lVar8 = (long)(this->input_).super_RepeatedPtrFieldBase.current_size_;
  pRVar1 = (this->input_).super_RepeatedPtrFieldBase.rep_;
  ppvVar6 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar6 = (void **)0x0;
  }
  lVar9 = lVar8 * 8;
  for (lVar7 = 0; lVar9 - lVar7 != 0; lVar7 = lVar7 + 8) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::FeatureDescription>
                      (*(FeatureDescription **)((long)ppvVar6 + lVar7));
    lVar8 = lVar8 + sVar3;
  }
  lVar9 = (long)(this->output_).super_RepeatedPtrFieldBase.current_size_;
  lVar8 = lVar8 + lVar9;
  pRVar1 = (this->output_).super_RepeatedPtrFieldBase.rep_;
  ppvVar6 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar6 = (void **)0x0;
  }
  for (lVar7 = 0; lVar9 * 8 != lVar7; lVar7 = lVar7 + 8) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::FeatureDescription>
                      (*(FeatureDescription **)((long)ppvVar6 + lVar7));
    lVar8 = lVar8 + sVar3;
  }
  lVar9 = (long)(this->state_).super_RepeatedPtrFieldBase.current_size_;
  lVar8 = lVar8 + lVar9;
  pRVar1 = (this->state_).super_RepeatedPtrFieldBase.rep_;
  ppvVar6 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar6 = (void **)0x0;
  }
  for (lVar7 = 0; lVar9 * 8 != lVar7; lVar7 = lVar7 + 8) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::FeatureDescription>
                      (*(FeatureDescription **)((long)ppvVar6 + lVar7));
    lVar8 = lVar8 + sVar3;
  }
  lVar9 = (long)(this->functions_).super_RepeatedPtrFieldBase.current_size_;
  lVar8 = lVar8 + lVar9 * 2;
  pRVar1 = (this->functions_).super_RepeatedPtrFieldBase.rep_;
  ppvVar6 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar6 = (void **)0x0;
  }
  for (lVar7 = 0; lVar9 * 8 != lVar7; lVar7 = lVar7 + 8) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::FunctionDescription>
                      (*(FunctionDescription **)((long)ppvVar6 + lVar7));
    lVar8 = lVar8 + sVar3;
  }
  lVar9 = (long)(this->traininginput_).super_RepeatedPtrFieldBase.current_size_;
  sVar3 = lVar8 + lVar9 * 2;
  pRVar1 = (this->traininginput_).super_RepeatedPtrFieldBase.rep_;
  ppvVar6 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar6 = (void **)0x0;
  }
  for (lVar8 = 0; lVar9 * 8 != lVar8; lVar8 = lVar8 + 8) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::FeatureDescription>
                      (*(FeatureDescription **)((long)ppvVar6 + lVar8));
    sVar3 = sVar3 + sVar4;
  }
  psVar5 = (string *)((ulong)(this->predictedfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  if (psVar5->_M_string_length != 0) {
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    sVar3 = sVar3 + sVar4 + 1;
  }
  psVar5 = (string *)
           ((ulong)(this->predictedprobabilitiesname_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  if (psVar5->_M_string_length != 0) {
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    sVar3 = sVar3 + sVar4 + 1;
  }
  psVar5 = (string *)((ulong)(this->defaultfunctionname_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  if (psVar5->_M_string_length != 0) {
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    sVar3 = sVar3 + sVar4 + 2;
  }
  if (this->metadata_ != (Metadata *)0x0 &&
      this != (ModelDescription *)_ModelDescription_default_instance_) {
    sVar4 = google::protobuf::internal::WireFormatLite::MessageSize<CoreML::Specification::Metadata>
                      (this->metadata_);
    sVar3 = sVar3 + sVar4 + 2;
  }
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    sVar3 = sVar3 + *(long *)((uVar2 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar3;
  return sVar3;
}

Assistant:

size_t ModelDescription::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ModelDescription)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .CoreML.Specification.FeatureDescription input = 1;
  total_size += 1UL * this->_internal_input_size();
  for (const auto& msg : this->input_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .CoreML.Specification.FeatureDescription output = 10;
  total_size += 1UL * this->_internal_output_size();
  for (const auto& msg : this->output_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .CoreML.Specification.FeatureDescription state = 13;
  total_size += 1UL * this->_internal_state_size();
  for (const auto& msg : this->state_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .CoreML.Specification.FunctionDescription functions = 20;
  total_size += 2UL * this->_internal_functions_size();
  for (const auto& msg : this->functions_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .CoreML.Specification.FeatureDescription trainingInput = 50;
  total_size += 2UL * this->_internal_traininginput_size();
  for (const auto& msg : this->traininginput_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // string predictedFeatureName = 11;
  if (!this->_internal_predictedfeaturename().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_predictedfeaturename());
  }

  // string predictedProbabilitiesName = 12;
  if (!this->_internal_predictedprobabilitiesname().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_predictedprobabilitiesname());
  }

  // string defaultFunctionName = 21;
  if (!this->_internal_defaultfunctionname().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_defaultfunctionname());
  }

  // .CoreML.Specification.Metadata metadata = 100;
  if (this->_internal_has_metadata()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *metadata_);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}